

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::MatchSetInst<false>::Exec
          (MatchSetInst<false> *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  Char CVar2;
  bool bVar3;
  
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  if (*inputOffset < inputLength) {
    CVar2 = input[*inputOffset];
    if ((ushort)CVar2 < 0x100) {
      bVar3 = ((this->super_SetMixin<false>).set.direct.vec[(ushort)CVar2 >> 5] >>
               ((ushort)CVar2 & 0x1f) & 1) != 0;
    }
    else {
      if ((this->super_SetMixin<false>).set.root == (CharSetNode *)0x0) goto LAB_00f02954;
      bVar3 = RuntimeCharSet<char16_t>::Get_helper
                        (&(this->super_SetMixin<false>).set,(uint)(ushort)CVar2);
    }
    if (bVar3 != false) {
      *inputOffset = *inputOffset + 1;
      *instPointer = *instPointer + 0x29;
      return false;
    }
  }
LAB_00f02954:
  bVar3 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  return bVar3;
}

Assistant:

inline bool MatchSetInst<IsNegation>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset >= inputLength || this->set.Get(input[inputOffset]) == IsNegation)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        inputOffset++;
        instPointer += sizeof(*this);
        return false;
    }